

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O0

MoveRegRegCommand * __thiscall
AssemblyCode::MoveRegRegCommand::ToString_abi_cxx11_(MoveRegRegCommand *this)

{
  bool bVar1;
  allocator local_109;
  CTemp local_108;
  CTemp local_e8;
  string local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [48];
  CTemp local_58;
  CTemp local_38;
  MoveRegRegCommand *this_local;
  
  this_local = this;
  IRT::CTemp::ToString_abi_cxx11_(&local_38);
  IRT::CTemp::ToString_abi_cxx11_(&local_58);
  bVar1 = std::operator!=(&local_38.name,&local_58.name);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    IRT::CTemp::ToString_abi_cxx11_(&local_e8);
    std::operator+((char *)local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"mov ");
    std::operator+(local_a8,(char *)local_c8);
    IRT::CTemp::ToString_abi_cxx11_(&local_108);
    std::operator+(local_88,local_a8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)local_88);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",&local_109);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  return this;
}

Assistant:

std::string AssemblyCode::MoveRegRegCommand::ToString( ) const {
    if (target.ToString() != source.ToString()) {
        return "mov " + target.ToString( ) + " " + source.ToString( ) + "\n";
    } else {
        return "";
    }
}